

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O3

int dynamicGetbuf(gdIOCtxPtr ctx,void *buf,int len)

{
  int iVar1;
  int iVar2;
  _func_int_gdIOCtx_ptr *p_Var3;
  uint uVar4;
  uint uVar5;
  
  p_Var3 = ctx[1].getC;
  iVar1 = *(int *)(p_Var3 + 0x14);
  uVar4 = 0;
  if (((-1 < (long)iVar1) && (iVar2 = *(int *)(p_Var3 + 0xc), iVar1 < iVar2)) &&
     ((uVar5 = *(int *)(p_Var3 + 8) - iVar1, len <= (int)uVar5 || (len = uVar5, 0 < (int)uVar5)))) {
    uVar5 = iVar2 - iVar1;
    if (len + iVar1 <= iVar2) {
      uVar5 = len;
    }
    if (-1 < (int)uVar5) {
      memcpy(buf,(void *)((long)iVar1 + *(long *)p_Var3),(ulong)uVar5);
      *(uint *)(p_Var3 + 0x14) = *(int *)(p_Var3 + 0x14) + uVar5;
      uVar4 = uVar5;
    }
  }
  return uVar4;
}

Assistant:

static int dynamicGetbuf(gdIOCtxPtr ctx, void *buf, int len)
{
	int rlen, remain;
	dpIOCtxPtr dctx;
	dynamicPtr *dp;

	dctx = (dpIOCtxPtr) ctx;
	dp = dctx->dp;

	if (dp->pos < 0 || dp->pos >= dp->realSize) {
		return 0;
	}

	remain = dp->logicalSize - dp->pos;
	if(remain >= len) {
		rlen = len;
	} else {
		if(remain <= 0) {
			return 0;
		}

		rlen = remain;
	}

	if (dp->pos + rlen > dp->realSize) {
		rlen = dp->realSize - dp->pos;
	}

	if (rlen < 0) {
		return 0;
	}

	memcpy(buf, (void *) ((char *)dp->data + dp->pos), rlen);
	dp->pos += rlen;

	return rlen;
}